

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O1

bool __thiscall cs::token_literal::dump(token_literal *this,ostream *o)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< Literal = \"",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(this->m_data)._M_dataplus._M_p,(this->m_data)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->m_literal)._M_dataplus._M_p,(this->m_literal)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," >",2);
  return true;
}

Assistant:

bool dump(std::ostream &o) const override
		{
			o << "< Literal = \"" << m_data << "\"" << m_literal << " >";
			return true;
		}